

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_decoder.h
# Opt level: O0

void __thiscall
draco::
MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::MeshPredictionSchemeTexCoordsPortableDecoder
          (MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,PointAttribute *attribute,
          PredictionSchemeWrapDecodingTransform<int,_int> *transform,
          MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *mesh_data)

{
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *in_RCX;
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *in_RDI;
  MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *in_stack_ffffffffffffffd0;
  PointAttribute *in_stack_ffffffffffffffd8;
  
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ::MeshPredictionSchemeDecoder
            (in_RCX,in_stack_ffffffffffffffd8,
             (PredictionSchemeWrapDecodingTransform<int,_int> *)in_stack_ffffffffffffffd0,in_RDI);
  in_RDI->mesh_ = (Mesh *)&PTR__MeshPredictionSchemeTexCoordsPortableDecoder_00273a48;
  MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ::MeshPredictionSchemeTexCoordsPortablePredictor(in_stack_ffffffffffffffd0,in_RDI);
  return;
}

Assistant:

MeshPredictionSchemeTexCoordsPortableDecoder(const PointAttribute *attribute,
                                               const TransformT &transform,
                                               const MeshDataT &mesh_data)
      : MeshPredictionSchemeDecoder<DataTypeT, TransformT, MeshDataT>(
            attribute, transform, mesh_data),
        predictor_(mesh_data) {}